

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void ravi_dump_stack(lua_State *L,char *s)

{
  ushort uVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  long lVar4;
  StkId pTVar5;
  uint uVar6;
  ushort uVar7;
  StkId pTVar8;
  ulong uVar9;
  GCObject *pGVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  
  if (s == (char *)0x0) {
    return;
  }
  pCVar2 = L->ci;
  puts("=======================");
  printf("Stack dump %s\n",s);
  puts("=======================");
  printf("L->top = %d\n",(ulong)((long)L->top - (long)L->stack) >> 4);
  do {
    if (pCVar2 == (CallInfo *)0x0) {
      putchar(10);
      return;
    }
    pTVar8 = pCVar2->func;
    uVar6 = (pTVar8->tt_ & 0x7f) - 6;
    uVar6 = uVar6 >> 4 | uVar6 * 0x10000000;
    if (uVar6 < 5) {
      uVar9 = (ulong)((long)pTVar8 - (long)L->stack) >> 4;
      switch(uVar6) {
      case 0:
        if (pTVar8->tt_ != 0x8006) {
          pcVar11 = "((((func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
LAB_00132d5d:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xa75,"void ravi_dump_ci(lua_State *, CallInfo *)");
        }
        if ((pTVar8->value_).f[8] != (_func_int_lua_State_ptr)0x6) {
          pcVar11 = "(((func)->value_).gc)->tt == ((6) | ((0) << 4))";
          goto LAB_00132d5d;
        }
        pTVar3 = pCVar2->top;
        lVar4 = *(long *)((pTVar8->value_).f + 0x18);
        pTVar5 = (pCVar2->u).l.base;
        pTVar8 = pTVar3 + -1;
        if (pTVar5 <= pTVar8) {
          uVar6 = (uint)((ulong)((long)pTVar3 - (long)L->stack) >> 4);
          uVar13 = (long)pTVar3 - (long)pTVar5;
          do {
            uVar6 = uVar6 - 1;
            uVar13 = uVar13 - 0x10;
            pcVar12 = "";
            pcVar11 = "";
            if (pTVar8 == pTVar5) {
              pcVar11 = "(base) ";
            }
            if (pTVar8 == L->top) {
              pcVar12 = "(L->top) ";
            }
            printf("stack[%d] reg[%d] = %s %s",(ulong)uVar6,uVar13 >> 4,pcVar11,pcVar12);
            uVar1 = pTVar8->tt_;
            if (uVar1 == 0x16) {
              pcVar11 = "light C function";
LAB_00132c19:
              puts(pcVar11);
            }
            else {
              if (uVar1 == 0x8026) {
                pcVar11 = "C closure";
                goto LAB_00132c19;
              }
              if ((uVar1 & 0x7f) == 0x46) {
                pcVar11 = "fast C function";
                goto LAB_00132c19;
              }
              if (uVar1 == 0x8006) {
                pcVar11 = "Lua closure";
                goto LAB_00132c19;
              }
              uVar7 = uVar1 & 0xf;
              if (uVar7 == 6) {
                pcVar11 = "function";
                goto LAB_00132c19;
              }
              if ((uVar1 | 0x10) != 0x8014) {
                if (uVar7 == 5) {
                  pcVar11 = "table";
                }
                else {
                  if (uVar7 == 4) goto LAB_00132c44;
                  if (0x12 < uVar1) {
                    if (uVar1 != 0x13) {
                      if (uVar1 == 0x8007) {
                        pcVar11 = "full user data";
                      }
                      else {
                        if (uVar1 != 0x8008) goto switchD_00132c9a_default;
                        pcVar11 = "thread";
                      }
                      goto LAB_00132c19;
                    }
                    pGVar10 = (pTVar8->value_).gc;
                    pcVar11 = "%lld\n";
                    goto LAB_00132c69;
                  }
                  switch(uVar1) {
                  case 0:
                    pcVar11 = "nil";
                    break;
                  case 1:
                    pcVar11 = "boolean";
                    break;
                  case 2:
                    pcVar11 = "light user data";
                    break;
                  case 3:
                    printf("%.6f\n",(pTVar8->value_).gc);
                    goto LAB_00132c1e;
                  default:
switchD_00132c9a_default:
                    pcVar11 = "other";
                  }
                }
                goto LAB_00132c19;
              }
LAB_00132c44:
              if (uVar7 != 4) {
                pcVar11 = "(((((((stack_ptr))->tt_)) & 0x0F)) == (4))";
LAB_00132d85:
                __assert_fail(pcVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                              ,0xa8a,"void ravi_dump_ci(lua_State *, CallInfo *)");
              }
              if ((((pTVar8->value_).gc)->tt & 0xf) != 4) {
                pcVar11 = "(((((stack_ptr)->value_).gc)->tt) & 0x0F) == 4";
                goto LAB_00132d85;
              }
              pGVar10 = (GCObject *)&(pTVar8->value_).gc[1].tt;
              pcVar11 = "\'%s\'\n";
LAB_00132c69:
              printf(pcVar11,pGVar10);
            }
LAB_00132c1e:
            pTVar8 = pTVar8 + -1;
          } while (pTVar5 <= pTVar8);
        }
        printf("stack[%d] = Lua function (registers = %d, params = %d, locals = %d)\n",
               uVar9 & 0xffffffff,(ulong)*(byte *)(lVar4 + 0xc),(ulong)*(byte *)(lVar4 + 10),
               (ulong)*(uint *)(lVar4 + 0x24));
        goto LAB_00132b50;
      case 1:
        pcVar11 = "stack[%d] = Light C function\n";
        break;
      case 2:
        pcVar11 = "stack[%d] = C closure\n";
        break;
      case 3:
        goto switchD_00132ac2_caseD_3;
      case 4:
        pcVar11 = "stack[%d] = Fast C function\n";
      }
      printf(pcVar11,uVar9 & 0xffffffff);
LAB_00132b50:
      puts("---> called from ");
    }
switchD_00132ac2_caseD_3:
    pCVar2 = pCVar2->previous;
  } while( true );
}

Assistant:

void ravi_dump_stack(lua_State *L, const char *s) {
  if (!s)
    return;
  CallInfo *ci = L->ci;
  printf("=======================\n");
  printf("Stack dump %s\n", s);
  printf("=======================\n");
  printf("L->top = %d\n", (int)(L->top - L->stack));
  while (ci) {
    ravi_dump_ci(L, ci);
    ci = ci->previous;
  }
  printf("\n");
}